

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneDiffer.cpp
# Opt level: O2

string * __thiscall
Assimp::dumpFace_abi_cxx11_(string *__return_storage_ptr__,Assimp *this,aiFace *face)

{
  char *pcVar1;
  uint i;
  ulong uVar2;
  stringstream stream;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  for (uVar2 = 0; uVar2 < *(uint *)this; uVar2 = uVar2 + 1) {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    pcVar1 = "\n";
    if (uVar2 < *(int *)this - 1) {
      pcVar1 = ", ";
    }
    std::operator<<(local_1a8,pcVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

static std::string dumpFace( const aiFace &face ) {
    std::stringstream stream;
    for ( unsigned int i = 0; i < face.mNumIndices; i++ ) {
        stream << face.mIndices[ i ];
        if ( i < face.mNumIndices - 1 ) {
            stream << ", ";
        }
        else {
            stream << "\n";
        }
    }
    return stream.str();
}